

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::saveModel(FastText *this)

{
  element_type *peVar1;
  long in_RDI;
  string fn;
  string *in_stack_00000208;
  FastText *in_stack_00000210;
  string local_28 [40];
  
  peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x174258);
  std::__cxx11::string::string(local_28,(string *)&peVar1->output);
  if ((*(byte *)(in_RDI + 0x98) & 1) == 0) {
    std::__cxx11::string::operator+=(local_28,".bin");
  }
  else {
    std::__cxx11::string::operator+=(local_28,".ftz");
  }
  saveModel(in_stack_00000210,in_stack_00000208);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void FastText::saveModel() {
	std::string fn(args_->output);
	if (quant_) {
		fn += ".ftz";
	} else {
		fn += ".bin";
	}
	saveModel(fn);
}